

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

int nn_btcp_create(nn_ep *ep)

{
  int iVar1;
  nn_usock *tran;
  nn_fsm_fn __s;
  size_t sVar2;
  char *pcVar3;
  nn_ep *in_RDI;
  size_t ipv4onlylen;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  char *pos;
  char *end;
  char *addr;
  nn_btcp *self;
  int rc;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  nn_usock *self_00;
  nn_fsm_fn p_Var4;
  nn_fsm_fn fn;
  nn_fsm *self_01;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  nn_ep *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  tran = (nn_usock *)nn_alloc_(0x13fb59);
  (tran->in).buf = (uint8_t *)in_RDI;
  if (tran == (nn_usock *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,0x75);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_ep_tran_setup(in_RDI,&nn_btcp_ep_ops,tran);
  __s = (nn_fsm_fn)nn_ep_getaddr(in_RDI);
  p_Var4 = __s;
  sVar2 = strlen((char *)__s);
  fn = p_Var4;
  pcVar3 = strrchr((char *)__s,0x3a);
  if (pcVar3 == (char *)0x0) {
    nn_free((void *)0x13fc62);
    local_4 = -0x16;
  }
  else {
    iVar1 = nn_port_resolve(pcVar3 + 1,(size_t)(p_Var4 + (sVar2 - (long)(pcVar3 + 1))));
    if (iVar1 < 0) {
      nn_free((void *)0x13fcc4);
      local_4 = -0x16;
    }
    else {
      self_01 = (nn_fsm *)0x4;
      nn_ep_getopt(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                   (void *)0x4,(size_t *)fn);
      if (self_01 != (nn_fsm *)0x4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                ,0x8b);
        fflush(_stderr);
        nn_err_abort();
      }
      iVar1 = nn_iface_resolve(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff3c,(sockaddr_storage *)0x4,(size_t *)fn);
      if (iVar1 < 0) {
        nn_free((void *)0x13fdb8);
        local_4 = -0x13;
      }
      else {
        self_00 = tran;
        nn_ep_getctx((nn_ep *)0x13fde2);
        nn_fsm_init_root(self_01,fn,(nn_fsm_fn)self_00,
                         (nn_ctx *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        nn_fsm_event_init((nn_fsm_event *)0x13fe0e);
        (tran->wfd).hndl.fd = 1;
        tran[1].in.len = 0;
        nn_list_init((nn_list *)&tran[1].in.batch);
        nn_fsm_start((nn_fsm *)0x13fe54);
        nn_usock_init(self_00,in_stack_ffffffffffffff1c,(nn_fsm *)0x13fe75);
        local_4 = nn_btcp_listen((nn_btcp *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
        if (local_4 == 0) {
          local_4 = 0;
        }
        else {
          nn_fsm_raise_from_src
                    (&self_00->fsm,
                     (nn_fsm_event *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0
                     ,0x13feb6);
        }
      }
    }
  }
  return local_4;
}

Assistant:

int nn_btcp_create (struct nn_ep *ep)
{
    int rc;
    struct nn_btcp *self;
    const char *addr;
    const char *end;
    const char *pos;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_btcp), "btcp");
    self->ep = ep;
    alloc_assert (self);

    nn_ep_tran_setup (ep, &nn_btcp_ep_ops, self);
    addr = nn_ep_getaddr (ep);

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    if (pos == NULL) {
        nn_free (self);
        return -EINVAL;
    }
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (rc < 0) {
        nn_free (self);
        return -EINVAL;
    }

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the address. */
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (nn_slow (rc < 0)) {
        nn_free (self);
        return -ENODEV;
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_btcp_handler, nn_btcp_shutdown,
        nn_ep_getctx (ep));
    nn_fsm_event_init (&self->listen_error);
    self->state = NN_BTCP_STATE_IDLE;
    self->atcp = NULL;
    nn_list_init (&self->atcps);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BTCP_SRC_USOCK, &self->fsm);

    rc = nn_btcp_listen (self);
    if (rc != 0) {
        nn_fsm_raise_from_src (&self->fsm, &self->listen_error,
            NN_BTCP_SRC_BTCP, NN_BTCP_TYPE_LISTEN_ERR);
        return rc;
    }

    return 0;
}